

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
       *this)

{
  TypedTermList t;
  bool bVar1;
  long in_RSI;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
  *in_RDI;
  TypedTermList TVar2;
  Renaming normalizer;
  Lhs *ld;
  Renaming *in_stack_ffffffffffffff48;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffff50;
  SmartPtr<Indexing::ResultSubstitution> *this_00;
  SortId in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar3;
  SortId SVar4;
  SmartPtr<Indexing::ResultSubstitution> local_78;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffff98;
  
  SVar4._content = (uint64_t)in_RDI;
  do {
    bVar1 = hasLeafData(in_stack_ffffffffffffff50);
    uVar3 = false;
    if (!bVar1) {
      uVar3 = findNextLeaf(in_stack_ffffffffffffff98);
    }
  } while ((bool)uVar3 != false);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::operator->
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *)
             0x3ea293);
  Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::next
            ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)0x3ea29b);
  TVar2._sort._content = in_stack_ffffffffffffff58._content;
  TVar2.super_TermList._content = in_stack_ffffffffffffff60._content;
  if ((*(byte *)(in_RSI + 0xe8) & 1) != 0) {
    Kernel::Renaming::Renaming((Renaming *)in_stack_ffffffffffffff50);
    TVar2 = Kernel::SelectedSummand::key((SelectedSummand *)in_stack_ffffffffffffff60._content);
    t.super_TermList._content._7_1_ = uVar3;
    t.super_TermList._content._0_7_ = in_stack_ffffffffffffff68;
    t._sort._content = SVar4._content;
    Kernel::Renaming::normalizeVariables((Renaming *)TVar2.super_TermList._content._content,t);
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::bdRecord
              (&in_stack_ffffffffffffff50->_algo,(BacktrackData *)in_stack_ffffffffffffff48);
    *(undefined1 *)(in_RSI + 0x148) = 1;
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::denormalize
              (&in_stack_ffffffffffffff50->_algo,in_stack_ffffffffffffff48);
    Kernel::Renaming::~Renaming((Renaming *)0x3ea33d);
  }
  this_00 = &local_78;
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::unifier
            ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)
             in_stack_ffffffffffffff48);
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
  ::QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
              *)TVar2.super_TermList._content._content,
             (SmartPtr<Indexing::ResultSubstitution> *)TVar2._sort._content._content,(Lhs *)this_00)
  ;
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(this_00);
  return in_RDI;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }